

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O1

bool dxil_spv::get_annotate_handle_meta(Impl *impl,CallInst *instruction,AnnotateHandleMeta *meta)

{
  ulong uVar1;
  bool bVar2;
  ResourceType resource_type;
  ValueKind VVar3;
  uint uVar4;
  uint32_t uVar5;
  Value *pVVar6;
  Instruction *this;
  mapped_type *pmVar7;
  ConstantAggregate *this_00;
  Constant *pCVar8;
  APInt *pAVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint32_t binding_range_hi;
  ulong uVar13;
  uint32_t binding_range_lo;
  __node_base_ptr p_Var14;
  __node_base_ptr p_Var15;
  Instruction *value;
  _Hash_node_base *p_Var16;
  __hashtable *__h;
  ConstantAggregate *this_01;
  uint32_t non_uniform_int;
  uint32_t opcode;
  __node_gen_type __node_gen;
  uint32_t local_50;
  Op local_4c;
  uint64_t local_48;
  CallInst *local_40;
  Value *local_38;
  
  pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  if (pVVar6 == (Value *)0x0) {
    value = (Instruction *)0x0;
  }
  else {
    this = (Instruction *)LLVMBC::Internal::resolve_proxy(pVVar6);
    VVar3 = LLVMBC::Value::get_value_kind((Value *)this);
    value = (Instruction *)0x0;
    if (VVar3 == Call) {
      value = this;
    }
  }
  if (value == (Instruction *)0x0) {
    return false;
  }
  bVar2 = get_constant_operand(value,0,&local_4c);
  if (!bVar2) {
    return false;
  }
  meta->resource_op = local_4c;
  local_50 = 0;
  if (local_4c == CreateHandleForLib) {
    pVVar6 = LLVMBC::Instruction::getOperand(value,1);
    uVar1 = (impl->llvm_global_variable_to_resource_mapping)._M_h._M_bucket_count;
    uVar13 = (ulong)pVVar6 % uVar1;
    p_Var14 = (impl->llvm_global_variable_to_resource_mapping)._M_h._M_buckets[uVar13];
    p_Var15 = (__node_base_ptr)0x0;
    if ((p_Var14 != (__node_base_ptr)0x0) &&
       (p_Var16 = p_Var14->_M_nxt, p_Var15 = p_Var14, pVVar6 != (Value *)p_Var14->_M_nxt[1]._M_nxt))
    {
      while (p_Var14 = p_Var16, p_Var16 = p_Var14->_M_nxt, p_Var16 != (_Hash_node_base *)0x0) {
        p_Var15 = (__node_base_ptr)0x0;
        if (((ulong)p_Var16[1]._M_nxt % uVar1 != uVar13) ||
           (p_Var15 = p_Var14, pVVar6 == (Value *)p_Var16[1]._M_nxt)) goto LAB_001624bb;
      }
      p_Var15 = (__node_base_ptr)0x0;
    }
LAB_001624bb:
    if (p_Var15 == (__node_base_ptr)0x0) {
      p_Var16 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var16 = p_Var15->_M_nxt;
    }
    if (p_Var16 != (_Hash_node_base *)0x0) {
      local_38 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      local_40 = (CallInst *)&impl->llvm_annotate_handle_lib_uses;
      std::
      _Hashtable<LLVMBC::Value_const*,LLVMBC::Value_const*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value_const*>,std::__detail::_Identity,std::equal_to<LLVMBC::Value_const*>,std::hash<LLVMBC::Value_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<LLVMBC::Value_const*,std::__detail::_AllocNode<dxil_spv::ThreadLocalAllocator<std::__detail::_Hash_node<LLVMBC::Value_const*,false>>>>
                ((_Hashtable<LLVMBC::Value_const*,LLVMBC::Value_const*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value_const*>,std::__detail::_Identity,std::equal_to<LLVMBC::Value_const*>,std::hash<LLVMBC::Value_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&impl->llvm_annotate_handle_lib_uses);
      meta->resource_type = *(ResourceType *)&p_Var16[2]._M_nxt;
      meta->binding_index = *(uint32_t *)((long)&p_Var16[2]._M_nxt + 4);
      meta->offset = (Value *)p_Var16[3]._M_nxt;
      local_50 = (uint32_t)*(byte *)&p_Var16[5]._M_nxt;
LAB_0016251c:
      meta->non_uniform = local_50 != 0;
      return true;
    }
  }
  else if (local_4c == CreateHandleFromBinding) {
    pVVar6 = LLVMBC::Instruction::getOperand(value,2);
    meta->offset = pVVar6;
    bVar2 = get_constant_operand(value,3,&local_50);
    if (bVar2) {
      pVVar6 = LLVMBC::Instruction::getOperand(value,1);
      if (pVVar6 == (Value *)0x0) {
        this_01 = (ConstantAggregate *)0x0;
      }
      else {
        this_00 = (ConstantAggregate *)LLVMBC::Internal::resolve_proxy(pVVar6);
        VVar3 = LLVMBC::Value::get_value_kind((Value *)this_00);
        this_01 = (ConstantAggregate *)0x0;
        if (VVar3 == ConstantAggregate) {
          this_01 = this_00;
        }
      }
      if (this_01 == (ConstantAggregate *)0x0) {
        pVVar6 = LLVMBC::Instruction::getOperand(value,1);
        pVVar6 = LLVMBC::Internal::resolve_proxy(pVVar6);
        VVar3 = LLVMBC::Value::get_value_kind(pVVar6);
        if (VVar3 != ConstantAggregateZero) {
          return false;
        }
        meta->resource_type = SRV;
        binding_range_lo = 0;
        binding_range_hi = 0;
        uVar5 = 0;
        resource_type = SRV;
      }
      else {
        uVar4 = LLVMBC::ConstantAggregate::getNumOperands(this_01);
        if (uVar4 != 4) {
          return false;
        }
        pCVar8 = LLVMBC::ConstantAggregate::getOperand(this_01,0);
        pAVar9 = LLVMBC::Constant::getUniqueInteger(pCVar8);
        local_48 = LLVMBC::APInt::getZExtValue(pAVar9);
        pCVar8 = LLVMBC::ConstantAggregate::getOperand(this_01,1);
        pAVar9 = LLVMBC::Constant::getUniqueInteger(pCVar8);
        uVar10 = LLVMBC::APInt::getZExtValue(pAVar9);
        pCVar8 = LLVMBC::ConstantAggregate::getOperand(this_01,2);
        pAVar9 = LLVMBC::Constant::getUniqueInteger(pCVar8);
        uVar11 = LLVMBC::APInt::getZExtValue(pAVar9);
        pCVar8 = LLVMBC::ConstantAggregate::getOperand(this_01,3);
        pAVar9 = LLVMBC::Constant::getUniqueInteger(pCVar8);
        uVar12 = LLVMBC::APInt::getZExtValue(pAVar9);
        resource_type = (ResourceType)uVar12;
        meta->resource_type = resource_type;
        binding_range_lo = (uint32_t)local_48;
        binding_range_hi = (uint32_t)uVar10;
        uVar5 = (uint32_t)uVar11;
      }
      uVar5 = Converter::Impl::find_binding_meta_index
                        (impl,binding_range_lo,binding_range_hi,uVar5,resource_type);
      meta->binding_index = uVar5;
      if (uVar5 == 0xffffffff) {
        return false;
      }
      goto LAB_0016251c;
    }
  }
  else if (local_4c == CreateHandleFromHeap) {
    local_40 = instruction;
    pmVar7 = std::__detail::
             _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&impl->llvm_annotate_handle_uses,(key_type *)&local_40);
    meta->resource_type = pmVar7->resource_type;
    meta->binding_index = 0xffffffff;
    pVVar6 = LLVMBC::Instruction::getOperand(value,1);
    meta->offset = pVVar6;
    bVar2 = get_constant_operand(value,3,&local_50);
    if (bVar2) goto LAB_0016251c;
  }
  return false;
}

Assistant:

bool get_annotate_handle_meta(Converter::Impl &impl, const llvm::CallInst *instruction,
                              AnnotateHandleMeta &meta)
{
	auto *handle = llvm::dyn_cast<llvm::CallInst>(instruction->getOperand(1));
	if (!handle)
		return false;

	uint32_t opcode;
	if (!get_constant_operand(handle, 0, &opcode))
		return false;

	meta.resource_op = DXIL::Op(opcode);
	uint32_t non_uniform_int = 0;

	if (meta.resource_op == DXIL::Op::CreateHandleFromHeap)
	{
		auto &annotation = impl.llvm_annotate_handle_uses[instruction];
		meta.resource_type = annotation.resource_type;
		meta.binding_index = UINT32_MAX; // Direct heap access.

		meta.offset = handle->getOperand(1);

		if (!get_constant_operand(handle, 3, &non_uniform_int))
			return false;
	}
	else if (meta.resource_op == DXIL::Op::CreateHandleFromBinding)
	{
		meta.offset = handle->getOperand(2);

		if (!get_constant_operand(handle, 3, &non_uniform_int))
			return false;

		if (auto *res_type = llvm::dyn_cast<llvm::ConstantAggregate>(handle->getOperand(1)))
		{
			if (res_type->getNumOperands() != 4)
				return false;

			uint32_t binding_range_lo = res_type->getOperand(0)->getUniqueInteger().getZExtValue();
			uint32_t binding_range_hi = res_type->getOperand(1)->getUniqueInteger().getZExtValue();
			uint32_t binding_space = res_type->getOperand(2)->getUniqueInteger().getZExtValue();
			meta.resource_type = DXIL::ResourceType(res_type->getOperand(3)->getUniqueInteger().getZExtValue());
			meta.binding_index = impl.find_binding_meta_index(
				binding_range_lo, binding_range_hi,
				binding_space, meta.resource_type);

			if (meta.binding_index == UINT32_MAX)
				return false;
		}
		else if (llvm::isa<llvm::ConstantAggregateZero>(handle->getOperand(1)))
		{
			meta.resource_type = DXIL::ResourceType(0);
			meta.binding_index = impl.find_binding_meta_index(0, 0, 0, meta.resource_type);
			if (meta.binding_index == UINT32_MAX)
				return false;
		}
		else
			return false;
	}
	else if (meta.resource_op == DXIL::Op::CreateHandleForLib)
	{
		auto itr = impl.llvm_global_variable_to_resource_mapping.find(handle->getOperand(1));
		if (itr == impl.llvm_global_variable_to_resource_mapping.end())
			return false;

		// Marks that the CreateHandleForLib is a dummy and should not actually emit a resource handle.
		impl.llvm_annotate_handle_lib_uses.insert(instruction->getOperand(1));

		meta.resource_type = itr->second.type;
		meta.binding_index = itr->second.meta_index;
		meta.offset = itr->second.offset;
		non_uniform_int = uint32_t(itr->second.non_uniform);
	}
	else
		return false;

	meta.non_uniform = non_uniform_int != 0;
	return true;
}